

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

iterator __thiscall
pstore::romfs::directory::find(directory *this,not_null<const_char_*> name,size_t length)

{
  bool bVar1;
  int iVar2;
  value_type *this_00;
  char *__s1;
  char *__s2;
  char *local_70;
  char *local_68;
  czstring n;
  pair<pstore::gsl::not_null<const_char_*>,_unsigned_long> local_58;
  pointer local_48;
  pointer local_40;
  pointer_based_iterator<const_pstore::romfs::dirent> local_38;
  pointer_based_iterator<const_pstore::romfs::dirent> it;
  iterator end;
  size_t length_local;
  directory *this_local;
  not_null<const_char_*> name_local;
  
  end.pos_ = (pointer)length;
  this_local = (directory *)name.ptr_;
  it.pos_ = (pointer)directory::end(this);
  local_40 = (pointer)begin(this);
  local_48 = it.pos_;
  local_58 = std::make_pair<pstore::gsl::not_null<char_const*>const&,unsigned_long&>
                       ((not_null<const_char_*> *)&this_local,(unsigned_long *)&end);
  local_38 = std::
             lower_bound<pstore::pointer_based_iterator<pstore::romfs::dirent_const>,std::pair<pstore::gsl::not_null<char_const*>,unsigned_long>,pstore::romfs::directory::find(pstore::gsl::not_null<char_const*>,unsigned_long)const::__0>
                       (local_40,local_48,&local_58);
  bVar1 = pointer_based_iterator<pstore::romfs::dirent_const>::operator!=
                    ((pointer_based_iterator<pstore::romfs::dirent_const> *)&local_38,&it);
  if (bVar1) {
    this_00 = pointer_based_iterator<const_pstore::romfs::dirent>::operator->(&local_38);
    local_70 = (char *)dirent::name(this_00);
    __s1 = pstore::gsl::not_null::operator_cast_to_char_((not_null *)&local_70);
    local_68 = __s1;
    __s2 = pstore::gsl::not_null::operator_cast_to_char_((not_null *)&this_local);
    iVar2 = strncmp(__s1,__s2,(size_t)end.pos_);
    if ((iVar2 == 0) && (local_68[(long)end.pos_] == '\0')) {
      return (iterator)local_38.pos_;
    }
  }
  return (iterator)it.pos_;
}

Assistant:

auto directory::find (gsl::not_null<char const *> const name, std::size_t length) const
            -> iterator {

            // Directories are sorted by name: we can use a binary search here.
            auto const end = this->end ();
            auto const it = std::lower_bound (
                this->begin (), end, std::make_pair (name, length),
                [] (dirent const & a,
                    std::pair<gsl::not_null<char const *>, std::size_t> const & b) {
                    return std::strncmp (a.name (), b.first, b.second) < 0;
                });
            if (it != end) {
                gsl::czstring const n = it->name ();
                if (std::strncmp (n, name, length) == 0 && n[length] == '\0') {
                    return it;
                }
            }
            return end;
        }